

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void inv_txfm2d_add_c(int32_t *input,uint16_t *output,int stride,TXFM_2D_FLIP_CFG *cfg,
                     int32_t *txfm_buf,TX_SIZE tx_size,int bd)

{
  int8_t iVar1;
  int8_t iVar2;
  uint16_t uVar3;
  int32_t iVar4;
  int iVar5;
  TxfmFunc p_Var6;
  TxfmFunc p_Var7;
  int32_t *piVar8;
  int32_t *piVar9;
  TXFM_2D_FLIP_CFG *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int32_t *in_R8;
  TX_SIZE in_R9B;
  int in_stack_00000008;
  int r;
  int c;
  int32_t *buf_ptr;
  int32_t *buf;
  int32_t *temp_out;
  int32_t *temp_in;
  int buf_offset;
  TxfmFunc txfm_func_row;
  TxfmFunc txfm_func_col;
  int8_t cos_bit_row;
  int8_t cos_bit_col;
  int8_t stage_range_col [12];
  int8_t stage_range_row [12];
  int rect_type;
  int8_t *shift;
  int txfm_size_row;
  int txfm_size_col;
  undefined4 in_stack_ffffffffffffff48;
  int32_t in_stack_ffffffffffffff4c;
  int32_t *in_stack_ffffffffffffff50;
  int32_t *piVar10;
  int local_a4;
  int local_a0;
  int local_9c;
  int32_t *local_98;
  int8_t local_5c [12];
  int8_t local_50 [12];
  int local_44;
  char *local_40;
  int local_34;
  int local_30;
  TX_SIZE local_29;
  int32_t *local_28;
  TXFM_2D_FLIP_CFG *local_20;
  int local_14;
  long local_10;
  long local_8;
  
  local_30 = tx_size_wide[in_RCX->tx_size];
  local_34 = tx_size_high[in_RCX->tx_size];
  local_40 = in_RCX->shift;
  local_29 = in_R9B;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_44 = get_rect_tx_log_ratio(local_30,local_34);
  av1_gen_inv_stage_range(local_5c,local_50,local_20,local_29,in_stack_00000008);
  iVar1 = local_20->cos_bit_col;
  iVar2 = local_20->cos_bit_row;
  p_Var6 = inv_txfm_type_to_func(local_20->txfm_type_col);
  p_Var7 = inv_txfm_type_to_func(local_20->txfm_type_row);
  if (local_30 < local_34) {
    local_a4 = local_34;
  }
  else {
    local_a4 = local_30;
  }
  piVar8 = local_28 + local_a4;
  piVar9 = piVar8 + local_a4;
  local_98 = piVar9;
  for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
    iVar5 = local_44;
    if (local_44 < 1) {
      iVar5 = -local_44;
    }
    if (iVar5 == 1) {
      for (local_9c = 0; local_9c < local_30; local_9c = local_9c + 1) {
        iVar4 = round_shift((long)*(int *)(local_8 + (long)(local_9c * local_34 + local_a0) * 4) *
                            0xb50,0xc);
        local_28[local_9c] = iVar4;
      }
      clamp_buf(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                (int8_t)((uint)in_stack_ffffffffffffff48 >> 0x18));
      (*p_Var7)(local_28,local_98,iVar2,local_50);
    }
    else {
      for (local_9c = 0; local_9c < local_30; local_9c = local_9c + 1) {
        local_28[local_9c] = *(int32_t *)(local_8 + (long)(local_9c * local_34 + local_a0) * 4);
      }
      clamp_buf(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                (int8_t)((uint)in_stack_ffffffffffffff48 >> 0x18));
      (*p_Var7)(local_28,local_98,iVar2,local_50);
    }
    (*av1_round_shift_array)(local_98,local_30,-(int)*local_40);
    local_98 = local_98 + local_30;
  }
  for (local_9c = 0; local_9c < local_30; local_9c = local_9c + 1) {
    if (local_20->lr_flip == 0) {
      for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
        local_28[local_a0] = piVar9[local_a0 * local_30 + local_9c];
      }
    }
    else {
      for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
        local_28[local_a0] = piVar9[local_a0 * local_30 + (local_30 - local_9c) + -1];
      }
    }
    if (in_stack_00000008 + 6 < 0x11) {
      iVar5 = 0x10;
    }
    else {
      iVar5 = in_stack_00000008 + 6;
    }
    piVar10 = local_28;
    clamp_buf(local_28,iVar5,(int8_t)((uint)in_stack_ffffffffffffff48 >> 0x18));
    (*p_Var6)(local_28,piVar8,iVar1,local_5c);
    (*av1_round_shift_array)(piVar8,local_34,-(int)local_40[1]);
    if (local_20->ud_flip == 0) {
      for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
        uVar3 = highbd_clip_pixel_add
                          ((uint16_t)((ulong)piVar10 >> 0x30),
                           CONCAT44(iVar5,in_stack_ffffffffffffff48),0);
        *(uint16_t *)(local_10 + (long)(local_a0 * local_14 + local_9c) * 2) = uVar3;
      }
    }
    else {
      for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
        uVar3 = highbd_clip_pixel_add
                          ((uint16_t)((ulong)piVar10 >> 0x30),
                           CONCAT44(iVar5,in_stack_ffffffffffffff48),0);
        *(uint16_t *)(local_10 + (long)(local_a0 * local_14 + local_9c) * 2) = uVar3;
      }
    }
  }
  return;
}

Assistant:

static inline void inv_txfm2d_add_c(const int32_t *input, uint16_t *output,
                                    int stride, TXFM_2D_FLIP_CFG *cfg,
                                    int32_t *txfm_buf, TX_SIZE tx_size,
                                    int bd) {
  // Note when assigning txfm_size_col, we use the txfm_size from the
  // row configuration and vice versa. This is intentionally done to
  // accurately perform rectangular transforms. When the transform is
  // rectangular, the number of columns will be the same as the
  // txfm_size stored in the row cfg struct. It will make no difference
  // for square transforms.
  const int txfm_size_col = tx_size_wide[cfg->tx_size];
  const int txfm_size_row = tx_size_high[cfg->tx_size];
  // Take the shift from the larger dimension in the rectangular case.
  const int8_t *shift = cfg->shift;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);
  int8_t stage_range_row[MAX_TXFM_STAGE_NUM];
  int8_t stage_range_col[MAX_TXFM_STAGE_NUM];
  assert(cfg->stage_num_row <= MAX_TXFM_STAGE_NUM);
  assert(cfg->stage_num_col <= MAX_TXFM_STAGE_NUM);
  av1_gen_inv_stage_range(stage_range_col, stage_range_row, cfg, tx_size, bd);

  const int8_t cos_bit_col = cfg->cos_bit_col;
  const int8_t cos_bit_row = cfg->cos_bit_row;
  const TxfmFunc txfm_func_col = inv_txfm_type_to_func(cfg->txfm_type_col);
  const TxfmFunc txfm_func_row = inv_txfm_type_to_func(cfg->txfm_type_row);

  // txfm_buf's length is  txfm_size_row * txfm_size_col + 2 *
  // AOMMAX(txfm_size_row, txfm_size_col)
  // it is used for intermediate data buffering
  const int buf_offset = AOMMAX(txfm_size_row, txfm_size_col);
  int32_t *temp_in = txfm_buf;
  int32_t *temp_out = temp_in + buf_offset;
  int32_t *buf = temp_out + buf_offset;
  int32_t *buf_ptr = buf;
  int c, r;

  // Rows
  for (r = 0; r < txfm_size_row; ++r) {
    if (abs(rect_type) == 1) {
      for (c = 0; c < txfm_size_col; ++c) {
        temp_in[c] = round_shift(
            (int64_t)input[c * txfm_size_row + r] * NewInvSqrt2, NewSqrt2Bits);
      }
      clamp_buf(temp_in, txfm_size_col, bd + 8);
      txfm_func_row(temp_in, buf_ptr, cos_bit_row, stage_range_row);
    } else {
      for (c = 0; c < txfm_size_col; ++c) {
        temp_in[c] = input[c * txfm_size_row + r];
      }
      clamp_buf(temp_in, txfm_size_col, bd + 8);
      txfm_func_row(temp_in, buf_ptr, cos_bit_row, stage_range_row);
    }
    av1_round_shift_array(buf_ptr, txfm_size_col, -shift[0]);
    buf_ptr += txfm_size_col;
  }

  // Columns
  for (c = 0; c < txfm_size_col; ++c) {
    if (cfg->lr_flip == 0) {
      for (r = 0; r < txfm_size_row; ++r)
        temp_in[r] = buf[r * txfm_size_col + c];
    } else {
      // flip left right
      for (r = 0; r < txfm_size_row; ++r)
        temp_in[r] = buf[r * txfm_size_col + (txfm_size_col - c - 1)];
    }
    clamp_buf(temp_in, txfm_size_row, AOMMAX(bd + 6, 16));
    txfm_func_col(temp_in, temp_out, cos_bit_col, stage_range_col);
    av1_round_shift_array(temp_out, txfm_size_row, -shift[1]);
    if (cfg->ud_flip == 0) {
      for (r = 0; r < txfm_size_row; ++r) {
        output[r * stride + c] =
            highbd_clip_pixel_add(output[r * stride + c], temp_out[r], bd);
      }
    } else {
      // flip upside down
      for (r = 0; r < txfm_size_row; ++r) {
        output[r * stride + c] = highbd_clip_pixel_add(
            output[r * stride + c], temp_out[txfm_size_row - r - 1], bd);
      }
    }
  }
}